

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O3

duckdb_logical_type
duckdb_param_logical_type(duckdb_prepared_statement prepared_statement,idx_t param_idx)

{
  bool bVar1;
  pointer pPVar2;
  PreparedStatementData *this;
  LogicalType *this_00;
  iterator iVar3;
  LogicalType param_type;
  string identifier;
  LogicalType LStack_58;
  string local_40;
  
  if ((prepared_statement != (duckdb_prepared_statement)0x0) &&
     (*(long *)(prepared_statement + 0x38) != 0)) {
    pPVar2 = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                           *)(prepared_statement + 0x38));
    bVar1 = duckdb::PreparedStatement::HasError(pPVar2);
    if (!bVar1) {
      duckdb_parameter_name_internal_abi_cxx11_(&local_40,prepared_statement,param_idx);
      if (local_40._M_string_length == 0) {
        this_00 = (LogicalType *)0x0;
      }
      else {
        duckdb::LogicalType::LogicalType(&LStack_58);
        pPVar2 = duckdb::
                 unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                 ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                               *)(prepared_statement + 0x38));
        this = duckdb::shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&pPVar2->data);
        bVar1 = duckdb::PreparedStatementData::TryGetType(this,&local_40,&LStack_58);
        if (bVar1) {
          this_00 = (LogicalType *)operator_new(0x18);
          duckdb::LogicalType::LogicalType(this_00,&LStack_58);
        }
        else {
          iVar3 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)prepared_statement,&local_40);
          if (iVar3.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
              ._M_cur == (__node_type *)0x0) {
            this_00 = (LogicalType *)0x0;
          }
          else {
            this_00 = (LogicalType *)operator_new(0x18);
            duckdb::LogicalType::LogicalType
                      (this_00,(LogicalType *)
                               ((long)iVar3.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
                                      ._M_cur + 0x68));
          }
        }
        duckdb::LogicalType::~LogicalType(&LStack_58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return (duckdb_logical_type)this_00;
      }
      operator_delete(local_40._M_dataplus._M_p);
      return (duckdb_logical_type)this_00;
    }
  }
  return (duckdb_logical_type)0x0;
}

Assistant:

duckdb_logical_type duckdb_param_logical_type(duckdb_prepared_statement prepared_statement, idx_t param_idx) {
	auto wrapper = reinterpret_cast<PreparedStatementWrapper *>(prepared_statement);
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError()) {
		return nullptr;
	}

	auto identifier = duckdb_parameter_name_internal(prepared_statement, param_idx);
	if (identifier == duckdb::string()) {
		return nullptr;
	}

	LogicalType param_type;

	if (wrapper->statement->data->TryGetType(identifier, param_type)) {
		return reinterpret_cast<duckdb_logical_type>(new LogicalType(param_type));
	}
	// The value_map is gone after executing the prepared statement
	// See if this is the case and we still have a value registered for it
	auto it = wrapper->values.find(identifier);
	if (it != wrapper->values.end()) {
		return reinterpret_cast<duckdb_logical_type>(new LogicalType(it->second.return_type));
	}
	return nullptr;
}